

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_math.c
# Opt level: O0

REF_STATUS ref_math_orthonormal_system(REF_DBL *orth0,REF_DBL *orth1,REF_DBL *orth2)

{
  double dVar1;
  double local_c8;
  double local_b8;
  double local_b0;
  double local_a0;
  double local_98;
  double local_88;
  double local_80;
  double local_70;
  double local_68;
  double local_58;
  double local_50;
  double local_40;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL dot;
  REF_DBL *orth2_local;
  REF_DBL *orth1_local;
  REF_DBL *orth0_local;
  
  orth0_local._4_4_ = ref_math_normalize(orth0);
  if (orth0_local._4_4_ == 0) {
    if (*orth0 <= 0.0) {
      local_40 = -*orth0;
    }
    else {
      local_40 = *orth0;
    }
    if (orth0[1] <= 0.0) {
      local_50 = -orth0[1];
    }
    else {
      local_50 = orth0[1];
    }
    if (local_50 <= local_40) {
      if (*orth0 <= 0.0) {
        local_58 = -*orth0;
      }
      else {
        local_58 = *orth0;
      }
      if (orth0[2] <= 0.0) {
        local_68 = -orth0[2];
      }
      else {
        local_68 = orth0[2];
      }
      if (local_68 <= local_58) {
        *orth1 = 0.0;
        orth1[1] = 1.0;
        orth1[2] = 0.0;
      }
    }
    if (orth0[1] <= 0.0) {
      local_70 = -orth0[1];
    }
    else {
      local_70 = orth0[1];
    }
    if (*orth0 <= 0.0) {
      local_80 = -*orth0;
    }
    else {
      local_80 = *orth0;
    }
    if (local_80 <= local_70) {
      if (orth0[1] <= 0.0) {
        local_88 = -orth0[1];
      }
      else {
        local_88 = orth0[1];
      }
      if (orth0[2] <= 0.0) {
        local_98 = -orth0[2];
      }
      else {
        local_98 = orth0[2];
      }
      if (local_98 <= local_88) {
        *orth1 = 0.0;
        orth1[1] = 0.0;
        orth1[2] = 1.0;
      }
    }
    if (orth0[2] <= 0.0) {
      local_a0 = -orth0[2];
    }
    else {
      local_a0 = orth0[2];
    }
    if (*orth0 <= 0.0) {
      local_b0 = -*orth0;
    }
    else {
      local_b0 = *orth0;
    }
    if (local_b0 <= local_a0) {
      if (orth0[2] <= 0.0) {
        local_b8 = -orth0[2];
      }
      else {
        local_b8 = orth0[2];
      }
      if (orth0[1] <= 0.0) {
        local_c8 = -orth0[1];
      }
      else {
        local_c8 = orth0[1];
      }
      if (local_c8 <= local_b8) {
        *orth1 = 1.0;
        orth1[1] = 0.0;
        orth1[2] = 0.0;
      }
    }
    dVar1 = orth0[2] * orth1[2] + *orth0 * *orth1 + orth0[1] * orth1[1];
    *orth1 = -dVar1 * *orth0 + *orth1;
    orth1[1] = -dVar1 * orth0[1] + orth1[1];
    orth1[2] = -dVar1 * orth0[2] + orth1[2];
    orth0_local._4_4_ = ref_math_normalize(orth1);
    if (orth0_local._4_4_ == 0) {
      *orth2 = orth0[1] * orth1[2] + -(orth0[2] * orth1[1]);
      orth2[1] = orth0[2] * *orth1 + -(*orth0 * orth1[2]);
      orth2[2] = *orth0 * orth1[1] + -(orth0[1] * *orth1);
      orth0_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_math.c",0x45,
             "ref_math_orthonormal_system",(ulong)orth0_local._4_4_,"orthonormalize orth1");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_math.c",0x31,
           "ref_math_orthonormal_system",(ulong)orth0_local._4_4_,"orthonormalize input orth0");
  }
  return orth0_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_math_orthonormal_system(REF_DBL *orth0, REF_DBL *orth1,
                                               REF_DBL *orth2) {
  REF_DBL dot;
  RSS(ref_math_normalize(orth0), "orthonormalize input orth0");
  if (ABS(orth0[0]) >= ABS(orth0[1]) && ABS(orth0[0]) >= ABS(orth0[2])) {
    orth1[0] = 0.0;
    orth1[1] = 1.0;
    orth1[2] = 0.0;
  }
  if (ABS(orth0[1]) >= ABS(orth0[0]) && ABS(orth0[1]) >= ABS(orth0[2])) {
    orth1[0] = 0.0;
    orth1[1] = 0.0;
    orth1[2] = 1.0;
  }
  if (ABS(orth0[2]) >= ABS(orth0[0]) && ABS(orth0[2]) >= ABS(orth0[1])) {
    orth1[0] = 1.0;
    orth1[1] = 0.0;
    orth1[2] = 0.0;
  }
  dot = ref_math_dot(orth0, orth1);
  orth1[0] -= dot * orth0[0];
  orth1[1] -= dot * orth0[1];
  orth1[2] -= dot * orth0[2];
  RSS(ref_math_normalize(orth1), "orthonormalize orth1");
  ref_math_cross_product(orth0, orth1, orth2);
  return REF_SUCCESS;
}